

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

int get_intv(tbx_t *tbx,kstring_t *str,tbx_intv_t *intv,int is_add)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  char *local_38;
  char *type;
  int c;
  int is_add_local;
  tbx_intv_t *intv_local;
  kstring_t *str_local;
  tbx_t *tbx_local;
  
  iVar2 = tbx_parse1(&tbx->conf,(int)str->l,str->s,intv);
  if (iVar2 == 0) {
    cVar1 = *intv->se;
    *intv->se = '\0';
    iVar2 = get_tid(tbx,intv->ss,is_add);
    intv->tid = iVar2;
    *intv->se = cVar1;
    bVar4 = false;
    if ((-1 < intv->tid) && (bVar4 = false, -1 < intv->beg)) {
      bVar4 = -1 < intv->end;
    }
    tbx_local._4_4_ = -1;
    if (bVar4) {
      tbx_local._4_4_ = 0;
    }
  }
  else {
    uVar3 = (uint)(ushort)(tbx->conf).preset;
    if (uVar3 == 1) {
      local_38 = "TBX_SAM";
    }
    else if (uVar3 == 2) {
      local_38 = "TBX_VCF";
    }
    else if (uVar3 == 0x10000) {
      local_38 = "TBX_UCSC";
    }
    else {
      local_38 = "TBX_GENERIC";
    }
    fprintf(_stderr,
            "[E::%s] failed to parse %s, was wrong -p [type] used?\nThe offending line was: \"%s\"\n"
            ,"get_intv",local_38,str->s);
    tbx_local._4_4_ = -1;
  }
  return tbx_local._4_4_;
}

Assistant:

static inline int get_intv(tbx_t *tbx, kstring_t *str, tbx_intv_t *intv, int is_add)
{
    if (tbx_parse1(&tbx->conf, str->l, str->s, intv) == 0) {
        int c = *intv->se;
        *intv->se = '\0'; intv->tid = get_tid(tbx, intv->ss, is_add); *intv->se = c;
        return (intv->tid >= 0 && intv->beg >= 0 && intv->end >= 0)? 0 : -1;
    } else {
        char *type = NULL;
        switch (tbx->conf.preset&0xffff)
        {
            case TBX_SAM: type = "TBX_SAM"; break;
            case TBX_VCF: type = "TBX_VCF"; break;
            case TBX_UCSC: type = "TBX_UCSC"; break;
            default: type = "TBX_GENERIC"; break;
        }
        fprintf(stderr, "[E::%s] failed to parse %s, was wrong -p [type] used?\nThe offending line was: \"%s\"\n", __func__, type, str->s);
        return -1;
    }
}